

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamePattern.cpp
# Opt level: O0

double Tld_Dga_Eval_T_A(size_t len,uint8_t *val)

{
  size_t sVar1;
  byte bVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double kl;
  double p;
  int j;
  uint8_t t_group_index;
  size_t i;
  double dStack_40;
  uint8_t previous_group;
  double klt;
  size_t count [4];
  uint8_t *val_local;
  size_t len_local;
  
  dStack_40 = 0.0;
  i._7_1_ = 2;
  count[3] = (size_t)val;
  memset(&klt,0,0x20);
  for (_j = 0; _j < len; _j = _j + 1) {
    bVar2 = transition_group[(int)(*(byte *)(count[3] + _j) - 10)];
    if (i._7_1_ < 2) {
      lVar3 = (long)(int)((uint)i._7_1_ * 2 + (uint)bVar2);
      count[lVar3 + -1] = count[lVar3 + -1] + 1;
    }
    i._7_1_ = bVar2;
  }
  for (p._0_4_ = 0; p._0_4_ < 4; p._0_4_ = p._0_4_ + 1) {
    sVar1 = count[(long)p._0_4_ + -1];
    auVar6._8_4_ = (int)(sVar1 >> 0x20);
    auVar6._0_8_ = sVar1;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(len >> 0x20);
    auVar7._0_8_ = len;
    auVar7._12_4_ = 0x45300000;
    dVar4 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0) +
            transition_group_weight[p._0_4_]) /
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)len) - 4503599627370496.0));
    dVar5 = log(dVar4 / transition_group_proba[p._0_4_]);
    dStack_40 = dVar4 * dVar5 + dStack_40;
  }
  return dStack_40;
}

Assistant:

static double Tld_Dga_Eval_T_A(size_t len, uint8_t * val)
{
    size_t count[4];
    double klt = 0;
    uint8_t previous_group = 2;

    memset(count, 0, sizeof(count));

    for (size_t i = 0; i<len; i++)
    {
        uint8_t t_group_index = transition_group[val[i] - 10];

        if (previous_group < 2)
        {
            count[2 * previous_group + t_group_index] ++;
        }
        previous_group = t_group_index;
    }

    for (int j = 0; j < 4; j++)
    {
        double p = ((double)count[j] + (double)transition_group_weight[j]) / ((double)(len));
        double kl = p * log(p / transition_group_proba[j]);
        klt += kl;
    }

    return klt;
}